

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Tables *pTVar2;
  pointer pcVar3;
  bool bVar4;
  Type TVar5;
  string *psVar6;
  long lVar7;
  undefined8 *puVar8;
  SourceCodeInfo *pSVar9;
  string *psVar10;
  FileOptions *pFVar11;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar12;
  EnumOptions *pEVar13;
  MessageOptions *pMVar14;
  EnumValueOptions *pEVar15;
  DescriptorBuilder *this_00;
  Symbol SVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  string local_70;
  string *local_50;
  string *local_48;
  string *local_40;
  size_type local_38;
  
  this_00 = this;
  SVar16 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode);
  aVar12 = SVar16.field_1;
  TVar5 = SVar16.type;
  if (((TVar5 == NULL_SYMBOL) && (TVar5 = NULL_SYMBOL, this->pool_->allow_unknown_ == true)) &&
     (bVar4 = ValidateQualifiedName(this_00,name), aVar12 = DAT_002925f8,
     TVar5 = (anonymous_namespace)::kNullSymbol, bVar4)) {
    pTVar2 = this->tables_;
    if (*(name->_M_dataplus)._M_p == '.') {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)name);
      psVar6 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      psVar6 = DescriptorPool::Tables::AllocateString(pTVar2,name);
    }
    lVar7 = std::__cxx11::string::rfind((char)psVar6,0x2e);
    local_50 = psVar6;
    if (lVar7 == -1) {
      local_40 = (string *)(anonymous_namespace)::kEmptyString_abi_cxx11_;
      local_48 = psVar6;
    }
    else {
      pTVar2 = this->tables_;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)psVar6);
      local_40 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar2 = this->tables_;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
      local_48 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    psVar6 = local_50;
    puVar8 = (undefined8 *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xa0);
    memset(puVar8,0,0xa0);
    pSVar9 = SourceCodeInfo::default_instance();
    puVar8[0x13] = pSVar9;
    pTVar2 = this->tables_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + psVar6->_M_string_length);
    std::__cxx11::string::append((char *)&local_70);
    psVar10 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
    psVar6 = local_40;
    *puVar8 = psVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    puVar8[1] = psVar6;
    puVar8[2] = this->pool_;
    pFVar11 = FileOptions::default_instance();
    puVar8[0x11] = pFVar11;
    puVar8[0x12] = FileDescriptorTables::kEmpty;
    if (placeholder_type == PLACEHOLDER_ENUM) {
      *(undefined4 *)(puVar8 + 0xb) = 1;
      aVar12.descriptor = (Descriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x38);
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(puVar8 + 0xc))->descriptor = (Descriptor *)aVar12;
      *(undefined8 *)(aVar12.descriptor + 0x18) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x20) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x28) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x30) = 0;
      *(string **)(aVar12.descriptor + 8) = local_50;
      *(string **)aVar12.descriptor = local_48;
      *(undefined8 **)(aVar12.descriptor + 0x10) = puVar8;
      pEVar13 = EnumOptions::default_instance();
      *(EnumOptions **)(aVar12.descriptor + 0x20) = pEVar13;
      aVar12.descriptor[0x28] = (Descriptor)0x1;
      aVar12.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
      *(undefined4 *)(aVar12.descriptor + 0x2c) = 1;
      puVar8 = (undefined8 *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x28);
      *(undefined8 **)(aVar12.descriptor + 0x30) = puVar8;
      *puVar8 = 0;
      puVar8[1] = 0;
      puVar8[2] = 0;
      puVar8[3] = 0;
      puVar8[4] = 0;
      pTVar2 = this->tables_;
      paVar1 = &local_70.field_2;
      local_38 = 0x11;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      local_70._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_38);
      local_70.field_2._M_allocated_capacity = local_38;
      *(undefined8 *)local_70._M_dataplus._M_p = 0x4c4f484543414c50;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 8) = 'D';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 9) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 10) = 'R';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xb) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xc) = 'V';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xd) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xe) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xf) = 'U';
      local_70._M_dataplus._M_p[0x10] = 'E';
      local_70._M_string_length = local_38;
      local_70._M_dataplus._M_p[local_38] = '\0';
      psVar10 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      *puVar8 = psVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (psVar6->_M_string_length == 0) {
        puVar8[1] = *puVar8;
      }
      else {
        pTVar2 = this->tables_;
        pcVar3 = (psVar6->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + psVar6->_M_string_length);
        std::__cxx11::string::append((char *)&local_70);
        psVar6 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
        puVar8[1] = psVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      *(undefined4 *)(puVar8 + 2) = 0;
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(puVar8 + 3))->descriptor = (Descriptor *)aVar12;
      pEVar15 = EnumValueOptions::default_instance();
      puVar8[4] = pEVar15;
      TVar5 = ENUM;
    }
    else {
      *(undefined4 *)(puVar8 + 9) = 1;
      aVar12.descriptor = (Descriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x78);
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(puVar8 + 10))->descriptor = (Descriptor *)aVar12;
      *(undefined8 *)(aVar12.descriptor + 0x18) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x20) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x28) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x30) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x38) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x40) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x48) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x50) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x58) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x60) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x68) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x70) = 0;
      *(string **)(aVar12.descriptor + 8) = local_50;
      *(string **)aVar12.descriptor = local_48;
      *(undefined8 **)(aVar12.descriptor + 0x10) = puVar8;
      pMVar14 = MessageOptions::default_instance();
      *(MessageOptions **)(aVar12.descriptor + 0x20) = pMVar14;
      aVar12.descriptor[0x28] = (Descriptor)0x1;
      aVar12.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
      TVar5 = MESSAGE;
      if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
        *(undefined4 *)(aVar12.descriptor + 0x58) = 1;
        puVar8 = (undefined8 *)DescriptorPool::Tables::AllocateBytes(this->tables_,8);
        *(undefined8 **)(aVar12.descriptor + 0x60) = puVar8;
        *puVar8 = 0x2000000000000001;
      }
    }
  }
  SVar16._4_4_ = 0;
  SVar16.type = TVar5;
  SVar16.field_1.descriptor = aVar12.descriptor;
  return SVar16;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const string& name, const string& relative_to,
    PlaceholderType placeholder_type, ResolveMode resolve_mode) {
  Symbol result = LookupSymbolNoPlaceholder(
      name, relative_to, resolve_mode);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = NewPlaceholder(name, placeholder_type);
  }
  return result;
}